

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.hpp
# Opt level: O0

void __thiscall
m2d::savanna::request<get_yahoo_endpoint>::request
          (request<get_yahoo_endpoint> *this,get_yahoo_endpoint *e)

{
  int local_24;
  duration<long,_std::ratio<1L,_1L>_> local_20;
  get_yahoo_endpoint *local_18;
  get_yahoo_endpoint *e_local;
  request<get_yahoo_endpoint> *this_local;
  
  this->follow_location = false;
  local_18 = e;
  e_local = (get_yahoo_endpoint *)this;
  get_yahoo_endpoint::get_yahoo_endpoint(&this->endpoint,e);
  this->version = 0xb;
  std::__cxx11::string::string((string *)&this->body);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->header_fields);
  local_24 = 0x1e;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_20,&local_24);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&this->timeout_interval,&local_20);
  return;
}

Assistant:

request(Endpoint e)
		    : endpoint(e)
		{
			static_assert(std::is_base_of<savanna::endpoint, Endpoint>::value, "Endpoint not derived from endpoint_t");
		}